

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psrlw_mips(uint64_t fs,uint64_t ft)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = (uint)ft & 0x7f;
  if (0x1f < uVar2) {
    return 0;
  }
  bVar1 = (byte)uVar2;
  return CONCAT44((uint)(fs >> 0x20) >> (bVar1 & 0x1f),(uint)fs >> (bVar1 & 0x1f));
}

Assistant:

uint64_t helper_psrlw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] >>= ft;
    }
    return vs.d;
}